

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
spirv_cross::Compiler::ActiveBuiltinHandler::handle
          (ActiveBuiltinHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  ID *__k;
  uint uVar1;
  Variant *pVVar2;
  Decoration *pDVar3;
  SPIRVariable *var;
  SPIRType *pSVar4;
  SPIRConstant *pSVar5;
  mapped_type *pmVar6;
  SPIRType *type;
  TypeID *pTVar7;
  ulong uVar8;
  bool bVar9;
  __hashtable *__h;
  BuiltIn local_4c;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_48;
  Bitset *local_40;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_38;
  
  bVar9 = true;
  if ((int)opcode < 0x53) {
    switch(opcode) {
    case OpFunctionCall:
      if (2 < length) {
        if (length - 3 != 0) {
          uVar8 = 0;
          do {
            add_if_builtin(this,args[uVar8 + 3],false);
            uVar8 = uVar8 + 1;
          } while (length - 3 != uVar8);
          return true;
        }
        return true;
      }
      break;
    default:
      goto switchD_0033a551_caseD_3a;
    case OpLoad:
switchD_0033a551_caseD_3d:
      if (2 < length) {
        args = args + 2;
LAB_0033a826:
        add_if_builtin(this,*args,false);
        return true;
      }
      break;
    case OpStore:
      if (length != 0) goto LAB_0033a826;
      break;
    case OpCopyMemory:
      if (1 < length) {
        add_if_builtin(this,*args,false);
        args = args + 1;
        goto LAB_0033a826;
      }
      break;
    case OpAccessChain:
    case OpInBoundsAccessChain:
    case OpPtrAccessChain:
      if (3 < length) {
        uVar8 = (ulong)args[2];
        if ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size <= uVar8) {
          return true;
        }
        pVVar2 = (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
        if (pVVar2[uVar8].type == TypeVariable) {
          var = Variant::get<spirv_cross::SPIRVariable>(pVVar2 + uVar8);
          uVar8 = 0;
          add_if_builtin(this,args[2],false);
          pSVar4 = get_variable_data_type(this->compiler,var);
          bVar9 = var->storage != StorageClassInput;
          local_40 = &this->compiler->active_input_builtins + bVar9;
          local_48 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&(&this->compiler->active_input_builtins)[bVar9].higher;
          do {
            if ((uVar8 == 0 && opcode == OpPtrAccessChain) ||
               ((pSVar4->array).super_VectorView<unsigned_int>.buffer_size != 0)) {
              pTVar7 = &pSVar4->parent_type;
            }
            else {
              if (*(int *)&(pSVar4->super_IVariant).field_0xc != 0xf) {
                return true;
              }
              pSVar5 = Variant::get<spirv_cross::SPIRConstant>
                                 ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.
                                  ptr + args[uVar8 + 3]);
              uVar1 = (pSVar5->m).c[0].r[0].u32;
              __k = &(pSVar4->super_IVariant).self;
              pmVar6 = ::std::__detail::
                       _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&(this->compiler->ir).meta,__k);
              if (uVar1 < (uint)(pmVar6->members).super_VectorView<spirv_cross::Meta::Decoration>.
                                buffer_size) {
                pmVar6 = ::std::__detail::
                         _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)&(this->compiler->ir).meta,__k);
                pDVar3 = (pmVar6->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
                if (pDVar3[uVar1].builtin == true) {
                  local_4c = pDVar3[uVar1].builtin_type;
                  if (local_4c < 0x40) {
                    local_40->lower = local_40->lower | 1L << ((byte)local_4c & 0x3f);
                  }
                  else {
                    local_38 = local_48;
                    ::std::
                    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    ::
                    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                              (local_48,&local_4c,&local_38);
                  }
                  type = Variant::get<spirv_cross::SPIRType>
                                   ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.
                                    ptr + (pSVar4->member_types).
                                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                          .ptr[uVar1].id);
                  handle_builtin(this,type,pDVar3[uVar1].builtin_type,
                                 &pDVar3[uVar1].decoration_flags);
                }
              }
              pTVar7 = (pSVar4->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr + uVar1;
            }
            pSVar4 = Variant::get<spirv_cross::SPIRType>
                               ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr
                                + pTVar7->id);
            uVar8 = uVar8 + 1;
          } while (length - 3 != uVar8);
          return true;
        }
        return true;
      }
    }
  }
  else {
    if (opcode == OpCopyObject) goto switchD_0033a551_caseD_3d;
    if (opcode == OpSelect) {
      if (4 < length) {
        add_if_builtin(this,args[3],false);
        args = args + 4;
        goto LAB_0033a826;
      }
    }
    else {
      if (opcode != OpPhi) {
        return true;
      }
      if (1 < length) {
        if (length - 2 != 0) {
          uVar8 = 0;
          do {
            add_if_builtin(this,args[uVar8 + 2],false);
            uVar8 = uVar8 + 2;
          } while (uVar8 < length - 2);
          return true;
        }
        return true;
      }
    }
  }
  bVar9 = false;
switchD_0033a551_caseD_3a:
  return bVar9;
}

Assistant:

bool Compiler::ActiveBuiltinHandler::handle(spv::Op opcode, const uint32_t *args, uint32_t length)
{
	switch (opcode)
	{
	case OpStore:
		if (length < 1)
			return false;

		add_if_builtin(args[0]);
		break;

	case OpCopyMemory:
		if (length < 2)
			return false;

		add_if_builtin(args[0]);
		add_if_builtin(args[1]);
		break;

	case OpCopyObject:
	case OpLoad:
		if (length < 3)
			return false;

		add_if_builtin(args[2]);
		break;

	case OpSelect:
		if (length < 5)
			return false;

		add_if_builtin(args[3]);
		add_if_builtin(args[4]);
		break;

	case OpPhi:
	{
		if (length < 2)
			return false;

		uint32_t count = length - 2;
		args += 2;
		for (uint32_t i = 0; i < count; i += 2)
			add_if_builtin(args[i]);
		break;
	}

	case OpFunctionCall:
	{
		if (length < 3)
			return false;

		uint32_t count = length - 3;
		args += 3;
		for (uint32_t i = 0; i < count; i++)
			add_if_builtin(args[i]);
		break;
	}

	case OpAccessChain:
	case OpInBoundsAccessChain:
	case OpPtrAccessChain:
	{
		if (length < 4)
			return false;

		// Only consider global variables, cannot consider variables in functions yet, or other
		// access chains as they have not been created yet.
		auto *var = compiler.maybe_get<SPIRVariable>(args[2]);
		if (!var)
			break;

		// Required if we access chain into builtins like gl_GlobalInvocationID.
		add_if_builtin(args[2]);

		// Start traversing type hierarchy at the proper non-pointer types.
		auto *type = &compiler.get_variable_data_type(*var);

		auto &flags =
		    var->storage == StorageClassInput ? compiler.active_input_builtins : compiler.active_output_builtins;

		uint32_t count = length - 3;
		args += 3;
		for (uint32_t i = 0; i < count; i++)
		{
			// Pointers
			if (opcode == OpPtrAccessChain && i == 0)
			{
				type = &compiler.get<SPIRType>(type->parent_type);
				continue;
			}

			// Arrays
			if (!type->array.empty())
			{
				type = &compiler.get<SPIRType>(type->parent_type);
			}
			// Structs
			else if (type->basetype == SPIRType::Struct)
			{
				uint32_t index = compiler.get<SPIRConstant>(args[i]).scalar();

				if (index < uint32_t(compiler.ir.meta[type->self].members.size()))
				{
					auto &decorations = compiler.ir.meta[type->self].members[index];
					if (decorations.builtin)
					{
						flags.set(decorations.builtin_type);
						handle_builtin(compiler.get<SPIRType>(type->member_types[index]), decorations.builtin_type,
						               decorations.decoration_flags);
					}
				}

				type = &compiler.get<SPIRType>(type->member_types[index]);
			}
			else
			{
				// No point in traversing further. We won't find any extra builtins.
				break;
			}
		}
		break;
	}

	default:
		break;
	}

	return true;
}